

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::noOverlapMerge
          (AlignmentRecord *this,string *algn,string *ref,string *dna,string *qualities,
          string *nucigar,int *c_pos,int *q_pos,int *ref_pos,int *ref_rel_pos,int i)

{
  char cVar1;
  char cVar2;
  const_reference pvVar3;
  char *pcVar4;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *in_R8;
  string *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int in_stack_00000028;
  string r;
  ShortDnaSequence *s;
  char c;
  AlignmentRecord *in_stack_ffffffffffffff18;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  string local_b8 [32];
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  long local_40;
  value_type local_31;
  string *local_30;
  string *local_28;
  string *local_20;
  string *local_18;
  string *local_10;
  
  local_40 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (in_stack_00000028 == 1) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),
                        (long)*in_stack_00000008);
    local_31 = *pvVar3;
    local_40 = in_RDI + 0x68;
    getReferenceSeq1_abi_cxx11_(in_stack_ffffffffffffff18);
    std::__cxx11::string::operator=(local_60,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0xf8),
                        (long)*in_stack_00000008);
    local_31 = *pvVar3;
    local_40 = in_RDI + 0x118;
    getReferenceSeq2_abi_cxx11_(in_stack_ffffffffffffff18);
    std::__cxx11::string::operator=(local_60,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  if (local_31 == 'H') {
    *in_stack_00000020 = *in_stack_00000020 + 1;
    *in_stack_00000018 = *in_stack_00000018 + 1;
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  else if (local_31 == 'I') {
    cVar1 = ShortDnaSequence::operator[]
                      ((ShortDnaSequence *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  in_stack_ffffffffffffff20))),
                       (size_t)in_stack_ffffffffffffff18);
    std::__cxx11::string::operator+=(local_20,cVar1);
    cVar1 = ShortDnaSequence::operator[]
                      ((ShortDnaSequence *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  in_stack_ffffffffffffff20))),
                       (size_t)in_stack_ffffffffffffff18);
    std::__cxx11::string::operator+=(local_10,cVar1);
    cVar1 = ShortDnaSequence::qualityChar
                      ((ShortDnaSequence *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  in_stack_ffffffffffffff20))),
                       (size_t)in_stack_ffffffffffffff18);
    std::__cxx11::string::operator+=(local_28,cVar1);
    std::__cxx11::string::operator+=(local_18,'I');
    std::__cxx11::string::operator+=(local_30,'I');
    *in_stack_00000010 = *in_stack_00000010 + 1;
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  else if (local_31 == 'D') {
    std::__cxx11::string::operator+=(local_10,'D');
    pcVar4 = (char *)std::__cxx11::string::at((ulong)local_60);
    std::__cxx11::string::operator+=(local_18,*pcVar4);
    *in_stack_00000020 = *in_stack_00000020 + 1;
    std::__cxx11::string::operator+=(local_30,'D');
    *in_stack_00000018 = *in_stack_00000018 + 1;
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  else if (local_31 == 'S') {
    *in_stack_00000020 = *in_stack_00000020 + 1;
    *in_stack_00000018 = *in_stack_00000018 + 1;
    *in_stack_00000010 = *in_stack_00000010 + 1;
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  else if (local_31 == 'M') {
    cVar1 = ShortDnaSequence::operator[]
                      ((ShortDnaSequence *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  in_stack_ffffffffffffff20))),
                       (size_t)in_stack_ffffffffffffff18);
    std::__cxx11::string::operator+=(local_20,cVar1);
    cVar2 = ShortDnaSequence::operator[]
                      ((ShortDnaSequence *)
                       CONCAT17(cVar1,CONCAT16(in_stack_ffffffffffffff26,
                                               CONCAT15(in_stack_ffffffffffffff25,
                                                        in_stack_ffffffffffffff20))),
                       (size_t)in_stack_ffffffffffffff18);
    std::__cxx11::string::operator+=(local_10,cVar2);
    cVar1 = ShortDnaSequence::qualityChar
                      ((ShortDnaSequence *)
                       CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(in_stack_ffffffffffffff25,
                                                              in_stack_ffffffffffffff20))),
                       (size_t)in_stack_ffffffffffffff18);
    std::__cxx11::string::operator+=(local_28,cVar1);
    pcVar4 = (char *)std::__cxx11::string::at((ulong)local_60);
    std::__cxx11::string::operator+=(local_18,*pcVar4);
    std::__cxx11::string::operator+=(local_30,local_31);
    *in_stack_00000020 = *in_stack_00000020 + 1;
    *in_stack_00000018 = *in_stack_00000018 + 1;
    *in_stack_00000010 = *in_stack_00000010 + 1;
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void AlignmentRecord::noOverlapMerge(std::string& algn,std::string& ref,std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos, int& q_pos, int& ref_pos, int& ref_rel_pos, int i) const{
    char c;
    const ShortDnaSequence* s = 0;
    std::string r = "";
    if (i == 1){
        c = this->cigar1_unrolled[c_pos];
        s = &this->sequence1;
        r = this->getReferenceSeq1();
    } else {
        c = this->cigar2_unrolled[c_pos];
        s = &this->sequence2;
        r = this->getReferenceSeq2();
    }
    if (c == 'H'){
        ref_rel_pos++;
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += (*s)[q_pos];
        algn += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        ref+= 'I';
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        algn += 'D';
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_rel_pos++;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += (*s)[q_pos];
        algn += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        ref+= r.at(ref_rel_pos);

        nucigar += c;
        ref_rel_pos++;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);

    }
}